

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::ChaiScript_Basic::do_eval
          (ChaiScript_Basic *this,string *t_input,string *t_filename,bool param_3)

{
  pointer pCVar1;
  pointer pAVar2;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte in_R8B;
  Boxed_Value BVar3;
  Return_Value *rv;
  unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_> local_38;
  AST_NodePtr p;
  bool param_3_local;
  string *t_filename_local;
  string *t_input_local;
  ChaiScript_Basic *this_local;
  
  p._M_t.super___uniq_ptr_impl<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>.
  _M_t.super__Tuple_impl<0UL,_chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>.
  super__Head_base<0UL,_chaiscript::AST_Node_*,_false>._M_head_impl._7_1_ = in_R8B & 1;
  pCVar1 = Catch::clara::std::
           unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
           ::operator->((unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
                         *)&t_input[9]._M_string_length);
  (**pCVar1->_vptr_ChaiScript_Parser_Base)
            (&local_38,pCVar1,t_filename,CONCAT71(in_register_00000009,param_3));
  pAVar2 = Catch::clara::std::
           unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>::operator->
                     (&local_38);
  detail::Dispatch_State::Dispatch_State
            ((Dispatch_State *)&rv,(Dispatch_Engine *)&t_input[9].field_2);
  (*pAVar2->_vptr_AST_Node[1])(this,pAVar2,&rv);
  Catch::clara::std::unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>::
  ~unique_ptr(&local_38);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_eval(const std::string &t_input, const std::string &t_filename = "__EVAL__", bool /* t_internal*/ = false) {
      try {
        const auto p = m_parser->parse(t_input, t_filename);
        return p->eval(chaiscript::detail::Dispatch_State(m_engine));
      } catch (chaiscript::eval::detail::Return_Value &rv) {
        return rv.retval;
      }
    }